

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.h
# Opt level: O0

void __thiscall crnlib::dxt5_endpoint_optimizer::params::params(params *this)

{
  params *this_local;
  
  this->m_block_index = 0;
  this->m_pPixels = (color_quad_u8 *)0x0;
  this->m_num_pixels = 0;
  this->m_comp_index = 3;
  this->m_quality = cCRNDXTQualityUber;
  this->m_use_both_block_types = true;
  return;
}

Assistant:

params() :
                m_block_index(0),
                m_pPixels(nullptr),
                m_num_pixels(0),
                m_comp_index(3),
                m_quality(cCRNDXTQualityUber),
                m_use_both_block_types(true)
            {
            }